

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileCheckpointWriter::WriteTable
          (SingleFileCheckpointWriter *this,TableCatalogEntry *table,Serializer *serializer)

{
  int iVar1;
  undefined4 extraout_var;
  DataTableInfo *pDVar2;
  pointer this_00;
  pointer *__ptr;
  unique_ptr<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>,_true> writer;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> table_lock;
  undefined1 local_28 [16];
  
  (*serializer->_vptr_Serializer[2])(serializer,100,"table");
  Serializer::WriteValue<duckdb::TableCatalogEntry>(serializer,table);
  (*serializer->_vptr_Serializer[3])(serializer);
  iVar1 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                     ((shared_ptr<duckdb::DataTableInfo,_true> *)
                      (CONCAT44(extraout_var,iVar1) + 0x18));
  shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&(pDVar2->checkpoint_lock).internals);
  StorageLockInternals::GetExclusiveLock((StorageLockInternals *)(local_28 + 8));
  GetTableDataWriter((SingleFileCheckpointWriter *)local_28,(TableCatalogEntry *)this);
  if ((__uniq_ptr_impl<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>_>)
      local_28._0_8_ !=
      (__uniq_ptr_impl<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>_>)0x0)
  {
    this_00 = unique_ptr<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>,_true>
              ::operator->((unique_ptr<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>,_true>
                            *)local_28);
    TableDataWriter::WriteTableData(this_00,serializer);
  }
  if ((tuple<duckdb::TableDataWriter_*,_std::default_delete<duckdb::TableDataWriter>_>)
      local_28._0_8_ != (_Head_base<0UL,_duckdb::TableDataWriter_*,_false>)0x0) {
    (*(*(_func_int ***)local_28._0_8_)[1])();
  }
  PartialBlockManager::FlushPartialBlocks(&this->partial_block_manager);
  if ((AttachedDatabase *)local_28._8_8_ != (AttachedDatabase *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_28._8_8_);
    operator_delete((void *)local_28._8_8_);
  }
  return;
}

Assistant:

void SingleFileCheckpointWriter::WriteTable(TableCatalogEntry &table, Serializer &serializer) {
	// Write the table metadata
	serializer.WriteProperty(100, "table", &table);

	// Write the table data
	auto table_lock = table.GetStorage().GetCheckpointLock();
	if (auto writer = GetTableDataWriter(table)) {
		writer->WriteTableData(serializer);
	}
	// flush any partial blocks BEFORE releasing the table lock
	// flushing partial blocks updates where data lives and is not thread-safe
	partial_block_manager.FlushPartialBlocks();
}